

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_expr.cpp
# Opt level: O0

void DtoS(ZCC_ExprConstant *expr,FSharedStringArena *str_arena)

{
  int iVar1;
  FString *pFVar2;
  char local_58 [4];
  int len;
  char str [64];
  FSharedStringArena *str_arena_local;
  ZCC_ExprConstant *expr_local;
  
  str._56_8_ = str_arena;
  iVar1 = mysnprintf(local_58,0x40,"%H",(expr->field_0).StringVal);
  pFVar2 = FSharedStringArena::Alloc((FSharedStringArena *)str._56_8_,local_58,(long)iVar1);
  (expr->field_0).StringVal = pFVar2;
  (expr->super_ZCC_Expression).Type = (PType *)TypeString;
  return;
}

Assistant:

static void DtoS(ZCC_ExprConstant *expr, FSharedStringArena &str_arena)
{
	// Convert to a string with enough precision such that converting
	// back to a double will not lose any data.
	char str[64];
	IGNORE_FORMAT_PRE
	int len = mysnprintf(str, countof(str), "%H", expr->DoubleVal);
	IGNORE_FORMAT_POST
	expr->StringVal = str_arena.Alloc(str, len);
	expr->Type = TypeString;
}